

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask16_8(uint32_t *in,uint32_t *out)

{
  uint32_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  vpmovsxbd_avx(ZEXT416(0x18100800));
  puVar1 = out + 4;
  auVar2 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (long)puVar1));
  vpmovsxbd_avx(ZEXT416(0x1c140c04));
  auVar3 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (long)puVar1));
  auVar3 = vpslld_avx(auVar3,0x10);
  auVar2 = vpor_avx(auVar3,auVar2);
  *(undefined1 (*) [16])out = auVar2;
  return puVar1;
}

Assistant:

uint32_t *__fastpackwithoutmask16_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  ++in;

  return out;
}